

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListModeViewBase::doStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  qsizetype qVar5;
  ulong uVar6;
  undefined8 *in_RSI;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  int row;
  int segPosition;
  int flowPosition;
  int deltaFlowPosition;
  int segEndPosition;
  int segStartPosition;
  bool useItemSize;
  QRect changedRect;
  QRect rect;
  QSize hint;
  int deltaSegHint;
  int deltaSegPosition;
  QPoint topLeft;
  QStyleOptionViewItem option;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QStyleOptionViewItem *in_stack_fffffffffffffe50;
  QCommonListViewBase *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  QListModeViewBase *in_stack_fffffffffffffe70;
  int local_188;
  int local_184;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  QRect local_148;
  QPoint local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  QSize local_120;
  undefined8 local_118;
  undefined8 local_110;
  QSize local_f0;
  int local_e8;
  int local_e4;
  QPoint local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  bVar2 = (bVar1 ^ 0xffU) & 1;
  local_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = initStaticLayout(in_stack_fffffffffffffe70,
                              (QListViewLayoutInfo *)
                              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8830d0);
  QCommonListViewBase::initViewItemOption
            ((QCommonListViewBase *)in_stack_fffffffffffffe50,
             (QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_c8 = *in_RSI;
  local_c0 = in_RSI[1];
  QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
                (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),(int)in_stack_fffffffffffffe50);
  local_e4 = -0x55555556;
  local_e8 = -0x55555556;
  if (*(int *)(in_RSI + 5) == 0) {
    local_160 = QRect::left((QRect *)0x88318c);
    local_164 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
    ;
    local_16c = QPoint::x((QPoint *)0x8831ab);
    local_170 = QPoint::y((QPoint *)0x8831bc);
    local_168 = QSize::width((QSize *)0x8831ce);
    if (bVar2 == 0) {
      local_184 = QSize::height((QSize *)0x8831f5);
    }
    else {
      local_184 = in_RDI->batchSavedDeltaSeg;
    }
    local_e4 = local_184;
    local_e8 = QSize::height((QSize *)0x883212);
  }
  else {
    local_160 = QRect::top((QRect *)0x883228);
    local_164 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                             );
    local_16c = QPoint::y((QPoint *)0x883247);
    local_170 = QPoint::x((QPoint *)0x883258);
    local_168 = QSize::height((QSize *)0x88326a);
    if (bVar2 == 0) {
      local_188 = QSize::width((QSize *)0x883291);
    }
    else {
      local_188 = in_RDI->batchSavedDeltaSeg;
    }
    local_e4 = local_188;
    local_e8 = QSize::width((QSize *)0x8832ae);
  }
  for (local_174 = *(int *)((long)in_RSI + 0x1c); local_174 <= *(int *)(in_RSI + 4);
      local_174 = local_174 + 1) {
    bVar1 = QCommonListViewBase::isHidden
                      ((QCommonListViewBase *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    if (bVar1) {
      QList<int>::append((QList<int> *)0x8832f9,in_stack_fffffffffffffe4c);
    }
    else {
      if (bVar2 != 0) {
        local_f0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        QCommonListViewBase::modelIndex
                  (&in_stack_fffffffffffffe70->super_QCommonListViewBase,in_stack_fffffffffffffe6c);
        local_f0 = QCommonListViewBase::itemSize
                             (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              (QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        if (*(int *)(in_RSI + 5) == 0) {
          local_168 = QSize::width((QSize *)0x883368);
          local_168 = local_168 + *(int *)(in_RSI + 3);
          local_e8 = QSize::height((QSize *)0x883381);
          local_e8 = local_e8 + *(int *)(in_RSI + 3);
        }
        else {
          local_168 = QSize::height((QSize *)0x88339f);
          local_168 = local_168 + *(int *)(in_RSI + 3);
          local_e8 = QSize::width((QSize *)0x8833b8);
          local_e8 = local_e8 + *(int *)(in_RSI + 3);
        }
      }
      if (((*(byte *)((long)in_RSI + 0x24) & 1) != 0) && (local_164 <= local_16c + local_168)) {
        QList<int>::append((QList<int> *)0x8833f4,in_stack_fffffffffffffe4c);
        local_16c = *(int *)(in_RSI + 3) + local_160;
        local_170 = *(int *)(in_RSI + 3) + local_e4 + local_170;
        QList<int>::append((QList<int> *)0x88342d,in_stack_fffffffffffffe4c);
        QList<int>::append((QList<int> *)0x88343f,in_stack_fffffffffffffe4c);
        local_e4 = 0;
      }
      in_stack_fffffffffffffe70 = (QListModeViewBase *)&in_RDI[3].qq;
      QList<int>::size((QList<int> *)(in_RDI + 1));
      QList<int>::append((QList<int> *)0x883472,in_stack_fffffffffffffe4c);
      QList<int>::append((QList<int> *)0x883484,in_stack_fffffffffffffe4c);
      piVar4 = qMax<int>(&local_e8,&local_e4);
      local_e4 = *piVar4;
      local_16c = *(int *)(in_RSI + 3) + local_168 + local_16c;
    }
  }
  *(int *)&in_RDI[4]._vptr_QCommonListViewBase = local_16c;
  in_RDI->batchSavedDeltaSeg = local_e4;
  in_RDI->batchStartRow = *(int *)(in_RSI + 4) + 1;
  if (*(int *)(in_RSI + 4) == *(int *)((long)in_RSI + 0x2c)) {
    local_16c = local_16c - *(int *)(in_RSI + 3);
  }
  local_118 = *in_RSI;
  local_110 = in_RSI[1];
  if (*(int *)(in_RSI + 5) == 0) {
    qVar5 = QList<int>::size((QList<int> *)&in_RDI[1].contentsSize);
    in_stack_fffffffffffffe6c = local_16c;
    if (qVar5 != 1) {
      in_stack_fffffffffffffe6c = QRect::right((QRect *)0x883580);
    }
    QRect::setRight((QRect *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    QRect::setBottom((QRect *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  }
  else {
    QRect::setRight((QRect *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    qVar5 = QList<int>::size((QList<int> *)&in_RDI[1].contentsSize);
    in_stack_fffffffffffffe68 = local_16c;
    if (qVar5 != 1) {
      in_stack_fffffffffffffe68 = QRect::bottom((QRect *)0x8835ef);
    }
    QRect::setBottom((QRect *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  }
  iVar3 = QRect::right((QRect *)0x883611);
  QRect::bottom((QRect *)0x883622);
  QSize::QSize((QSize *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
               in_stack_fffffffffffffe48);
  in_RDI->contentsSize = local_120;
  if (*(int *)(in_RSI + 4) == *(int *)((long)in_RSI + 0x2c)) {
    QList<int>::append((QList<int> *)0x88366e,in_stack_fffffffffffffe4c);
    in_stack_fffffffffffffe50 = (QStyleOptionViewItem *)&in_RDI[3].qq;
    QList<int>::size((QList<int> *)(in_RDI + 1));
    QList<int>::append((QList<int> *)0x883696,in_stack_fffffffffffffe4c);
    QList<int>::append((QList<int> *)0x8836a8,in_stack_fffffffffffffe4c);
    if ((*(byte *)((long)in_RSI + 0x24) & 1) == 0) {
      in_stack_fffffffffffffe4c = 0x7fffffff;
    }
    else {
      in_stack_fffffffffffffe4c = local_170 + local_e4;
    }
    QList<int>::append((QList<int> *)0x8836eb,in_stack_fffffffffffffe4c);
  }
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = QRect::bottomRight((QRect *)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48));
  QRect::QRect((QRect *)in_stack_fffffffffffffe70,
               (QPoint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               (QPoint *)CONCAT44(iVar3,in_stack_fffffffffffffe60));
  local_148 = QCommonListViewBase::clipRect((QCommonListViewBase *)0x883745);
  uVar6 = QRect::intersects((QRect *)&local_148);
  if ((uVar6 & 1) != 0) {
    QCommonListViewBase::viewport(in_RDI);
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffe50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModeViewBase::doStaticLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initStaticLayout(info);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    option.rect = info.bounds;
    option.rect.adjust(info.spacing, info.spacing, -info.spacing, -info.spacing);

    // The static layout data structures are as follows:
    // One vector contains the coordinate in the direction of layout flow.
    // Another vector contains the coordinates of the segments.
    // A third vector contains the index (model row) of the first item
    // of each segment.

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left();
        segEndPosition = info.bounds.width();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.height(); // dy
        deltaSegHint = info.grid.height();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top();
        segEndPosition = info.bounds.height();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.width(); // dx
        deltaSegHint = info.grid.width();
    }

    for (int row = info.first; row <= info.last; ++row) {
        if (isHidden(row)) { // ###
            flowPositions.append(flowPosition);
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                QSize hint = itemSize(option, modelIndex(row));
                if (info.flow == QListView::LeftToRight) {
                    deltaFlowPosition = hint.width() + info.spacing;
                    deltaSegHint = hint.height() + info.spacing;
                } else { // TopToBottom
                    deltaFlowPosition = hint.height() + info.spacing;
                    deltaSegHint = hint.width() + info.spacing;
                }
            }
            // create new segment
            if (info.wrap && (flowPosition + deltaFlowPosition >= segEndPosition)) {
                segmentExtents.append(flowPosition);
                flowPosition = info.spacing + segStartPosition;
                segPosition += info.spacing + deltaSegPosition;
                segmentPositions.append(segPosition);
                segmentStartRows.append(row);
                deltaSegPosition = 0;
            }
            // save the flow position of this item
            scrollValueMap.append(flowPositions.size());
            flowPositions.append(flowPosition);
            // prepare for the next item
            deltaSegPosition = qMax(deltaSegHint, deltaSegPosition);
            flowPosition += info.spacing + deltaFlowPosition;
        }
    }
    // used when laying out next batch
    batchSavedPosition = flowPosition;
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    if (info.last == info.max)
        flowPosition -= info.spacing; // remove extra spacing
    // set the contents size
    QRect rect = info.bounds;
    if (info.flow == QListView::LeftToRight) {
        rect.setRight(segmentPositions.size() == 1 ? flowPosition : info.bounds.right());
        rect.setBottom(segPosition + deltaSegPosition);
    } else { // TopToBottom
        rect.setRight(segPosition + deltaSegPosition);
        rect.setBottom(segmentPositions.size() == 1 ? flowPosition : info.bounds.bottom());
    }
    contentsSize = QSize(rect.right(), rect.bottom());
    // if it is the last batch, save the end of the segments
    if (info.last == info.max) {
        segmentExtents.append(flowPosition);
        scrollValueMap.append(flowPositions.size());
        flowPositions.append(flowPosition);
        segmentPositions.append(info.wrap ? segPosition + deltaSegPosition : INT_MAX);
    }
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}